

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteInt32
               (int field_number,int32 value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  
  uVar8 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar4;
  }
  pbVar7 = output->cur_;
  if (uVar8 < 0x80) {
    *pbVar7 = (byte)uVar8;
    pbVar7 = pbVar7 + 1;
  }
  else {
    *pbVar7 = (byte)uVar8 | 0x80;
    if (uVar8 < 0x4000) {
      pbVar7[1] = (byte)(uVar8 >> 7);
      pbVar7 = pbVar7 + 2;
    }
    else {
      pbVar7 = pbVar7 + 2;
      uVar8 = uVar8 >> 7;
      do {
        pbVar3 = pbVar7;
        pbVar3[-1] = (byte)uVar8 | 0x80;
        uVar2 = uVar8 >> 7;
        pbVar7 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar2;
      } while (bVar1);
      *pbVar3 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar7;
  if ((output->impl_).end_ <= pbVar7) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar7);
    output->cur_ = puVar4;
  }
  pbVar7 = output->cur_;
  if ((uint)value < 0x80) {
    *pbVar7 = (byte)value;
    pbVar7 = pbVar7 + 1;
  }
  else {
    *pbVar7 = (byte)value | 0x80;
    if ((uint)value < 0x4000) {
      pbVar7[1] = (byte)((ulong)(long)value >> 7);
      pbVar7 = pbVar7 + 2;
    }
    else {
      pbVar7 = pbVar7 + 2;
      uVar5 = (ulong)(long)value >> 7;
      do {
        pbVar3 = pbVar7;
        pbVar3[-1] = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar7 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar1);
      *pbVar3 = (byte)uVar6;
    }
  }
  output->cur_ = pbVar7;
  return;
}

Assistant:

void WireFormatLite::WriteInt32(int field_number, int32 value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteInt32NoTag(value, output);
}